

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Report_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::IO_Report_PDU::Decode(IO_Report_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pKVar1;
  pointer pKVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  pointer pKVar6;
  KString local_50;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (iVar4 + (uint)KVar3 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
    KException::KException(this_00,&local_50,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pKVar1 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pKVar2 = (this->m_vStdVarRecs).
           super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pKVar6 = pKVar1;
  if (pKVar2 != pKVar1) {
    do {
      (**pKVar6->_vptr_KRef_Ptr)(pKVar6);
      pKVar6 = pKVar6 + 1;
    } while (pKVar6 != pKVar2);
    (this->m_vStdVarRecs).
    super__Vector_base<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pKVar1;
  }
  IO_Header::Decode(&this->super_IO_Header,stream,ignoreHeader);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16SimSrc);
  KDataStream::Read(stream,&this->m_ui8RptTyp);
  KDataStream::Read(stream,&this->m_ui8Padding);
  (*(this->m_AtkEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_AtkEntityID,stream);
  (*(this->m_TgtEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_TgtEntityID,stream);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumStdVarRec);
  if (this->m_ui16NumStdVarRec != 0) {
    uVar5 = 0;
    do {
      DATA_TYPE::StandardVariable::FactoryDecodeStandardVariable((StdVarPtr *)&local_50,stream);
      std::
      vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
      ::emplace_back<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>
                ((vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>,std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>>>
                  *)&this->m_vStdVarRecs,(KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      local_50._M_dataplus._M_p = (pointer)&PTR__KRef_Ptr_00223190;
      UTILS::KRef_Ptr<KDIS::DATA_TYPE::StandardVariable>::unRef
                ((KRef_Ptr<KDIS::DATA_TYPE::StandardVariable> *)&local_50);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_ui16NumStdVarRec);
  }
  return;
}

Assistant:

void IO_Report_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < IO_REPORT_PDU_SIZE  )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vStdVarRecs.clear();

    IO_Header::Decode( stream, ignoreHeader );

    stream >> m_ui16SimSrc
           >> m_ui8RptTyp
           >> m_ui8Padding
           >> KDIS_STREAM m_AtkEntityID
           >> KDIS_STREAM m_TgtEntityID
           >> m_ui32Padding
           >> m_ui16NumStdVarRec;

    // Use the factory decode function for each standard variable
    for( KUINT16 i = 0; i < m_ui16NumStdVarRec; ++i )
    {
        m_vStdVarRecs.push_back( StandardVariable::FactoryDecodeStandardVariable( stream ) );
    }
}